

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_main.c
# Opt level: O0

CURLcode main_init(GlobalConfig *config)

{
  OperationConfig *pOVar1;
  CURL *pCVar2;
  CURLcode local_14;
  CURLcode result;
  GlobalConfig *config_local;
  
  config->showerror = -1;
  config->errors = _stderr;
  config->styled_output = true;
  pOVar1 = (OperationConfig *)malloc(0x4a0);
  config->last = pOVar1;
  config->first = pOVar1;
  if (config->first == (OperationConfig *)0x0) {
    helpf(_stderr,"error initializing curl\n");
    local_14 = CURLE_FAILED_INIT;
  }
  else {
    local_14 = curl_global_init(3);
    if (local_14 == CURLE_OK) {
      local_14 = get_libcurl_info();
      if (local_14 == CURLE_OK) {
        pCVar2 = (CURL *)curl_easy_init();
        config->easy = pCVar2;
        if (config->easy == (CURL *)0x0) {
          helpf(_stderr,"error initializing curl easy handle\n");
          local_14 = CURLE_FAILED_INIT;
          free(config->first);
        }
        else {
          config_init(config->first);
          config->first->easy = config->easy;
          config->first->global = config;
        }
      }
      else {
        helpf(_stderr,"error retrieving curl library information\n");
        free(config->first);
      }
    }
    else {
      helpf(_stderr,"error initializing curl library\n");
      free(config->first);
    }
  }
  return local_14;
}

Assistant:

static CURLcode main_init(struct GlobalConfig *config)
{
  CURLcode result = CURLE_OK;

#if defined(__DJGPP__) || defined(__GO32__)
  /* stop stat() wasting time */
  _djstat_flags |= _STAT_INODE | _STAT_EXEC_MAGIC | _STAT_DIRSIZE;
#endif

  /* Initialise the global config */
  config->showerror = -1;             /* Will show errors */
  config->errors = stderr;            /* Default errors to stderr */
  config->styled_output = TRUE;       /* enable detection */

  /* Allocate the initial operate config */
  config->first = config->last = malloc(sizeof(struct OperationConfig));
  if(config->first) {
    /* Perform the libcurl initialization */
    result = curl_global_init(CURL_GLOBAL_DEFAULT);
    if(!result) {
      /* Get information about libcurl */
      result = get_libcurl_info();

      if(!result) {
        /* Get a curl handle to use for all forthcoming curl transfers */
        config->easy = curl_easy_init();
        if(config->easy) {
          /* Initialise the config */
          config_init(config->first);
          config->first->easy = config->easy;
          config->first->global = config;
        }
        else {
          helpf(stderr, "error initializing curl easy handle\n");
          result = CURLE_FAILED_INIT;
          free(config->first);
        }
      }
      else {
        helpf(stderr, "error retrieving curl library information\n");
        free(config->first);
      }
    }
    else {
      helpf(stderr, "error initializing curl library\n");
      free(config->first);
    }
  }
  else {
    helpf(stderr, "error initializing curl\n");
    result = CURLE_FAILED_INIT;
  }

  return result;
}